

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

void pospopcnt_u8_avx512bw_popcnt4bit(uint8_t *data,size_t len,uint32_t *flag_counts)

{
  undefined1 (*pauVar1) [64];
  ulong uVar2;
  int j;
  int iVar3;
  long lVar4;
  undefined1 (*pauVar5) [64];
  undefined1 (*pauVar6) [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined8 uVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar49 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar50 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar51 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar52 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar53 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar54 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar55 [64];
  
  if ((len & 0xffffffffffffff00) == 0) {
    auVar32 = ZEXT1664((undefined1  [16])0x0);
    auVar35 = ZEXT1664((undefined1  [16])0x0);
    auVar30 = ZEXT1664((undefined1  [16])0x0);
    auVar31 = ZEXT1664((undefined1  [16])0x0);
    auVar40 = ZEXT1664((undefined1  [16])0x0);
    auVar43 = ZEXT1664((undefined1  [16])0x0);
    auVar36 = ZEXT1664((undefined1  [16])0x0);
    auVar39 = ZEXT1664((undefined1  [16])0x0);
    pauVar1 = (undefined1 (*) [64])data;
  }
  else {
    auVar18 = vpbroadcastq_avx512f(ZEXT816(0x5555555555555555));
    auVar19 = vpbroadcastq_avx512f(ZEXT816(0xaaaaaaaaaaaaaaaa));
    auVar20 = vpbroadcastq_avx512f(ZEXT816(0x3333333333333333));
    auVar21 = vpbroadcastq_avx512f(ZEXT816(0xcccccccccccccccc));
    auVar22 = vpbroadcastb_avx512bw(ZEXT116(0xf));
    auVar23 = vbroadcasti32x4_avx512f(_DAT_0011f1c0);
    pauVar1 = (undefined1 (*) [64])(data + (len & 0xffffffffffffff00));
    auVar44 = ZEXT1664((undefined1  [16])0x0);
    auVar39 = ZEXT1664((undefined1  [16])0x0);
    auVar36 = ZEXT1664((undefined1  [16])0x0);
    auVar43 = ZEXT1664((undefined1  [16])0x0);
    auVar40 = ZEXT1664((undefined1  [16])0x0);
    auVar31 = ZEXT1664((undefined1  [16])0x0);
    auVar30 = ZEXT1664((undefined1  [16])0x0);
    auVar35 = ZEXT1664((undefined1  [16])0x0);
    auVar32 = ZEXT1664((undefined1  [16])0x0);
    do {
      iVar3 = 0x3f;
      auVar7 = vpxord_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
      auVar55 = ZEXT1664(auVar7);
      auVar7 = vpxord_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
      auVar54 = ZEXT1664(auVar7);
      auVar7 = vpxord_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
      auVar53 = ZEXT1664(auVar7);
      auVar7 = vpxord_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
      auVar52 = ZEXT1664(auVar7);
      auVar7 = vpxord_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
      auVar51 = ZEXT1664(auVar7);
      auVar7 = vpxord_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
      auVar50 = ZEXT1664(auVar7);
      auVar7 = vpxord_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
      auVar49 = ZEXT1664(auVar7);
      auVar48 = ZEXT1664((undefined1  [16])0x0);
      pauVar5 = (undefined1 (*) [64])data;
      while( true ) {
        data = (uint8_t *)(pauVar5 + 4);
        auVar24 = vmovdqu64_avx512f(pauVar5[3]);
        auVar25 = vmovdqu64_avx512f(pauVar5[1]);
        auVar26 = vmovdqu64_avx512f(pauVar5[2]);
        auVar27 = vmovdqu64_avx512f(*pauVar5);
        iVar3 = iVar3 + -1;
        auVar28 = vpaddb_avx512bw(auVar24,auVar24);
        auVar29 = vpaddb_avx512bw(auVar25,auVar25);
        auVar24 = vpsrld_avx512f(auVar24,1);
        auVar25 = vpsrld_avx512f(auVar25,1);
        auVar28 = vpternlogq_avx512f(auVar28,auVar19,auVar26,0xe2);
        auVar24 = vpternlogq_avx512f(auVar24,auVar18,auVar26,0xe2);
        auVar26 = vpternlogq_avx512f(auVar29,auVar19,auVar27,0xe2);
        auVar25 = vpternlogq_avx512f(auVar25,auVar18,auVar27,0xe2);
        auVar27 = vpslld_avx512f(auVar28,2);
        auVar29 = vpslld_avx512f(auVar24,2);
        auVar24 = vpsrld_avx512f(auVar24,2);
        auVar28 = vpsrld_avx512f(auVar28,2);
        auVar27 = vpternlogq_avx512f(auVar27,auVar21,auVar26,0xe2);
        auVar29 = vpternlogq_avx512f(auVar29,auVar21,auVar25,0xe2);
        auVar24 = vpternlogq_avx512f(auVar24,auVar20,auVar25,0xe2);
        auVar25 = vpternlogq_avx512f(auVar28,auVar20,auVar26,0xe2);
        auVar26 = vpandq_avx512f(auVar27,auVar22);
        auVar27 = vpsrld_avx512f(auVar27,4);
        auVar28 = vpandq_avx512f(auVar29,auVar22);
        auVar26 = vpshufb_avx512bw(auVar23,auVar26);
        auVar55 = vpaddb_avx512bw(auVar26,auVar55);
        auVar26 = vpandq_avx512f(auVar27,auVar22);
        auVar27 = vpsrld_avx512f(auVar29,4);
        auVar26 = vpshufb_avx512bw(auVar23,auVar26);
        auVar51 = vpaddb_avx512bw(auVar26,auVar51);
        auVar26 = vpshufb_avx512bw(auVar23,auVar28);
        auVar28 = vpandq_avx512f(auVar25,auVar22);
        auVar25 = vpsrld_avx512f(auVar25,4);
        auVar25 = vpandq_avx512f(auVar25,auVar22);
        auVar54 = vpaddb_avx512bw(auVar26,auVar54);
        auVar26 = vpandq_avx512f(auVar27,auVar22);
        auVar25 = vpshufb_avx512bw(auVar23,auVar25);
        auVar26 = vpshufb_avx512bw(auVar23,auVar26);
        auVar49 = vpaddb_avx512bw(auVar25,auVar49);
        auVar50 = vpaddb_avx512bw(auVar26,auVar50);
        auVar25 = vpshufb_avx512bw(auVar23,auVar28);
        auVar26 = vpandq_avx512f(auVar24,auVar22);
        auVar26 = vpshufb_avx512bw(auVar23,auVar26);
        auVar53 = vpaddb_avx512bw(auVar25,auVar53);
        auVar24 = vpsrld_avx512f(auVar24,4);
        auVar52 = vpaddb_avx512bw(auVar26,auVar52);
        auVar24 = vpandq_avx512f(auVar24,auVar22);
        auVar24 = vpshufb_avx512bw(auVar23,auVar24);
        auVar48 = vpaddb_avx512bw(auVar24,auVar48);
        if (iVar3 == 0) break;
        pauVar6 = pauVar5 + 4;
        pauVar5 = (undefined1 (*) [64])data;
        if (pauVar6 == pauVar1) {
          auVar21 = ZEXT1664((undefined1  [16])0x0);
          auVar18 = vpsadbw_avx512bw(auVar54,auVar21);
          auVar19 = vpsadbw_avx512bw(auVar53,auVar21);
          auVar20 = vpsadbw_avx512bw(auVar55,auVar21);
          auVar36 = vpaddq_avx512f(auVar18,auVar36);
          auVar43 = vpaddq_avx512f(auVar19,auVar43);
          auVar18 = vpsadbw_avx512bw(auVar52,auVar21);
          auVar19 = vpsadbw_avx512bw(auVar51,auVar21);
          auVar39 = vpaddq_avx512f(auVar20,auVar39);
          auVar40 = vpaddq_avx512f(auVar18,auVar40);
          auVar31 = vpaddq_avx512f(auVar19,auVar31);
          auVar18 = vpsadbw_avx512bw(auVar50,auVar21);
          auVar19 = vpsadbw_avx512bw(auVar49,auVar21);
          auVar20 = vpsadbw_avx512bw(auVar48,auVar21);
          auVar30 = vpaddq_avx512f(auVar18,auVar30);
          auVar35 = vpaddq_avx512f(auVar19,auVar35);
          auVar32 = vpaddq_avx512f(auVar20,auVar32);
          goto LAB_00115390;
        }
      }
      in_ZMM22 = vpsadbw_avx512bw(auVar55,auVar44);
      in_ZMM21 = vpsadbw_avx512bw(auVar54,auVar44);
      in_ZMM20 = vpsadbw_avx512bw(auVar53,auVar44);
      in_ZMM19 = vpsadbw_avx512bw(auVar52,auVar44);
      in_ZMM18 = vpsadbw_avx512bw(auVar51,auVar44);
      in_ZMM17 = vpsadbw_avx512bw(auVar50,auVar44);
      in_ZMM16 = vpsadbw_avx512bw(auVar49,auVar44);
      auVar55 = vpsadbw_avx512bw(auVar48,auVar44);
      auVar39 = vpaddq_avx512f(in_ZMM22,auVar39);
      auVar36 = vpaddq_avx512f(in_ZMM21,auVar36);
      auVar43 = vpaddq_avx512f(in_ZMM20,auVar43);
      auVar40 = vpaddq_avx512f(in_ZMM19,auVar40);
      auVar31 = vpaddq_avx512f(in_ZMM18,auVar31);
      auVar30 = vpaddq_avx512f(in_ZMM17,auVar30);
      auVar35 = vpaddq_avx512f(in_ZMM16,auVar35);
      auVar32 = vpaddq_avx512f(auVar55,auVar32);
    } while ((undefined1 (*) [64])data != pauVar1);
  }
LAB_00115390:
  auVar7 = vpunpcklqdq_avx(auVar39._0_16_,auVar36._0_16_);
  auVar12 = auVar43._0_16_;
  auVar8 = vextracti32x4_avx512f(auVar43,2);
  auVar9 = vextracti32x4_avx512f(auVar43,3);
  vpextrq_avx(auVar12,1);
  auVar10 = vextracti32x4_avx512f(auVar40,2);
  auVar11 = vextracti32x4_avx512f(auVar40,3);
  vpextrq_avx(auVar40._0_16_,1);
  auVar16._0_8_ = auVar40._0_8_;
  auVar16._8_8_ = auVar16._0_8_;
  auVar16._16_8_ = auVar16._0_8_;
  auVar16._24_8_ = auVar16._0_8_;
  auVar17._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar7;
  auVar17._16_16_ = ZEXT116(1) * auVar12;
  auVar13 = vpbroadcastq_avx512vl();
  vpextrq_avx(auVar43._16_16_,1);
  vpextrq_avx(auVar40._16_16_,1);
  vpextrq_avx(auVar8,1);
  vpextrq_avx(auVar10,1);
  vpextrq_avx(auVar9,1);
  vpextrq_avx(auVar11,1);
  auVar33 = auVar35._0_16_;
  vpextrq_avx(auVar33,1);
  auVar34 = vpblendd_avx2(auVar17,auVar16,0xc0);
  auVar7 = vpunpckhqdq_avx(auVar39._0_16_,auVar36._0_16_);
  auVar13 = vpblendd_avx2(ZEXT1632(auVar7),auVar13,0x30);
  auVar14 = vpbroadcastq_avx512vl();
  vpextrq_avx(auVar32._0_16_,1);
  auVar13 = vpblendd_avx2(auVar13,auVar14,0xc0);
  auVar34 = vpaddq_avx2(auVar34,auVar13);
  auVar13 = vpunpcklqdq_avx2(auVar39._0_32_,auVar36._0_32_);
  auVar13 = vperm2i128_avx2(auVar13,ZEXT1632(auVar43._16_16_),0x21);
  uVar41 = auVar40._16_8_;
  auVar45._8_8_ = uVar41;
  auVar45._0_8_ = uVar41;
  auVar45._16_8_ = uVar41;
  auVar45._24_8_ = uVar41;
  auVar14 = vpbroadcastq_avx512vl();
  auVar13 = vpblendd_avx2(auVar13,auVar45,0xc0);
  auVar15 = vpbroadcastq_avx512vl();
  auVar34 = vpaddq_avx2(auVar34,auVar13);
  auVar13 = vpunpckhqdq_avx2(auVar39._0_32_,auVar36._0_32_);
  auVar16 = vextracti64x4_avx512f(auVar39,1);
  auVar17 = vextracti64x4_avx512f(auVar36,1);
  auVar13 = vperm2i128_avx2(auVar13,auVar15,0x31);
  auVar15 = vpbroadcastq_avx512vl();
  auVar13 = vpblendd_avx2(auVar13,auVar15,0xc0);
  auVar7 = vpunpckhqdq_avx(auVar16._0_16_,auVar17._0_16_);
  auVar14 = vpblendd_avx2(ZEXT1632(auVar7),auVar14,0x30);
  auVar15 = vpbroadcastq_avx512vl();
  auVar14 = vpblendd_avx2(auVar14,auVar15,0xc0);
  auVar34 = vpaddq_avx2(auVar14,auVar34);
  uVar41 = auVar10._0_8_;
  auVar46._8_8_ = uVar41;
  auVar46._0_8_ = uVar41;
  auVar46._16_8_ = uVar41;
  auVar46._24_8_ = uVar41;
  auVar34 = vpaddq_avx2(auVar34,auVar13);
  auVar7 = vpunpcklqdq_avx(auVar16._0_16_,auVar17._0_16_);
  auVar42._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar7;
  auVar42._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar8;
  auVar8 = vpunpcklqdq_avx(auVar31._0_16_,auVar30._0_16_);
  auVar15 = vpblendd_avx2(auVar42,auVar46,0xc0);
  auVar14 = vpunpcklqdq_avx2(auVar16,auVar17);
  auVar13 = vpunpckhqdq_avx2(auVar16,auVar17);
  auVar16 = vpbroadcastq_avx512vl();
  auVar14 = vperm2i128_avx2(auVar14,ZEXT1632(auVar9),0x21);
  auVar16 = vperm2i128_avx2(auVar13,auVar16,0x31);
  uVar41 = auVar11._0_8_;
  auVar47._8_8_ = uVar41;
  auVar47._0_8_ = uVar41;
  auVar47._16_8_ = uVar41;
  auVar47._24_8_ = uVar41;
  auVar17 = vpbroadcastq_avx512vl();
  auVar13 = vpblendd_avx2(auVar14,auVar47,0xc0);
  auVar14 = vpblendd_avx2(auVar16,auVar17,0xc0);
  auVar9 = vextracti32x4_avx512f(auVar32,3);
  auVar13 = vpaddq_avx2(auVar13,auVar15);
  auVar10 = vextracti32x4_avx512f(auVar32,2);
  vpextrq_avx(auVar35._16_16_,1);
  vpextrq_avx(auVar9,1);
  auVar13 = vpaddq_avx2(auVar13,auVar14);
  auVar14._0_8_ = auVar32._0_8_;
  auVar14._8_8_ = auVar14._0_8_;
  auVar14._16_8_ = auVar14._0_8_;
  auVar14._24_8_ = auVar14._0_8_;
  vpextrq_avx(auVar10,1);
  auVar34 = vpaddq_avx2(auVar34,auVar13);
  auVar11 = vextracti32x4_avx512f(auVar35,2);
  vpextrq_avx(auVar32._16_16_,1);
  auVar7 = vpmovqd_avx512vl(auVar34);
  auVar7 = vpaddd_avx(auVar7,*(undefined1 (*) [16])flag_counts);
  vpextrq_avx(auVar11,1);
  *(undefined1 (*) [16])flag_counts = auVar7;
  auVar12 = vextracti32x4_avx512f(auVar35,3);
  auVar34._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar8;
  auVar34._16_16_ = ZEXT116(1) * auVar33;
  auVar13 = vpbroadcastq_avx512vl();
  auVar34 = vpblendd_avx2(auVar34,auVar14,0xc0);
  auVar7 = vpunpckhqdq_avx(auVar31._0_16_,auVar30._0_16_);
  vpextrq_avx(auVar12,1);
  auVar13 = vpblendd_avx2(ZEXT1632(auVar7),auVar13,0x30);
  auVar14 = vpbroadcastq_avx512vl();
  auVar13 = vpblendd_avx2(auVar13,auVar14,0xc0);
  auVar34 = vpaddq_avx2(auVar34,auVar13);
  auVar13 = vpunpcklqdq_avx2(auVar31._0_32_,auVar30._0_32_);
  auVar13 = vperm2i128_avx2(auVar13,ZEXT1632(auVar35._16_16_),0x21);
  uVar41 = auVar32._16_8_;
  auVar15._8_8_ = uVar41;
  auVar15._0_8_ = uVar41;
  auVar15._16_8_ = uVar41;
  auVar15._24_8_ = uVar41;
  auVar14 = vpbroadcastq_avx512vl();
  auVar13 = vpblendd_avx2(auVar13,auVar15,0xc0);
  auVar15 = vpbroadcastq_avx512vl();
  auVar34 = vpaddq_avx2(auVar34,auVar13);
  auVar13 = vpunpckhqdq_avx2(auVar31._0_32_,auVar30._0_32_);
  auVar16 = vextracti64x4_avx512f(auVar31,1);
  auVar17 = vextracti64x4_avx512f(auVar30,1);
  auVar13 = vperm2i128_avx2(auVar13,auVar15,0x31);
  auVar15 = vpbroadcastq_avx512vl();
  auVar13 = vpblendd_avx2(auVar13,auVar15,0xc0);
  auVar7 = vpunpckhqdq_avx(auVar16._0_16_,auVar17._0_16_);
  auVar14 = vpblendd_avx2(ZEXT1632(auVar7),auVar14,0x30);
  auVar15 = vpbroadcastq_avx512vl();
  auVar14 = vpblendd_avx2(auVar14,auVar15,0xc0);
  auVar34 = vpaddq_avx2(auVar34,auVar14);
  uVar41 = auVar10._0_8_;
  auVar37._8_8_ = uVar41;
  auVar37._0_8_ = uVar41;
  auVar37._16_8_ = uVar41;
  auVar37._24_8_ = uVar41;
  auVar34 = vpaddq_avx2(auVar34,auVar13);
  auVar7 = vpunpcklqdq_avx(auVar16._0_16_,auVar17._0_16_);
  auVar13._0_16_ = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar7;
  auVar13._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar11;
  auVar15 = vpblendd_avx2(auVar13,auVar37,0xc0);
  auVar14 = vpunpcklqdq_avx2(auVar16,auVar17);
  auVar13 = vpunpckhqdq_avx2(auVar16,auVar17);
  auVar16 = vpbroadcastq_avx512vl();
  auVar14 = vperm2i128_avx2(auVar14,ZEXT1632(auVar12),0x21);
  auVar16 = vperm2i128_avx2(auVar13,auVar16,0x31);
  uVar41 = auVar9._0_8_;
  auVar38._8_8_ = uVar41;
  auVar38._0_8_ = uVar41;
  auVar38._16_8_ = uVar41;
  auVar38._24_8_ = uVar41;
  auVar17 = vpbroadcastq_avx512vl();
  auVar13 = vpblendd_avx2(auVar14,auVar38,0xc0);
  auVar14 = vpblendd_avx2(auVar16,auVar17,0xc0);
  auVar13 = vpaddq_avx2(auVar15,auVar13);
  auVar13 = vpaddq_avx2(auVar13,auVar14);
  auVar34 = vpaddq_avx2(auVar34,auVar13);
  auVar7 = vpmovqd_avx512vl(auVar34);
  auVar7 = vpaddd_avx(auVar7,*(undefined1 (*) [16])(flag_counts + 4));
  *(undefined1 (*) [16])(flag_counts + 4) = auVar7;
  if ((len & 0xff) != 0) {
    uVar2 = 0;
    do {
      lVar4 = 0;
      do {
        flag_counts[lVar4] =
             flag_counts[lVar4] + (uint)(((byte)(*pauVar1)[uVar2] >> ((uint)lVar4 & 0x1f) & 1) != 0)
        ;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      uVar2 = uVar2 + 1;
    } while (uVar2 != (len & 0xff));
  }
  return;
}

Assistant:

void pospopcnt_u8_avx512bw_popcnt4bit(const uint8_t* data, size_t len, uint32_t* flag_counts) {
    const __m512i zero = _mm512_setzero_si512();

    __m512i counter_a = zero;
    __m512i counter_b = zero;
    __m512i counter_c = zero;
    __m512i counter_d = zero;
    __m512i counter_e = zero;
    __m512i counter_f = zero;
    __m512i counter_g = zero;
    __m512i counter_h = zero;

    const __m512i popcnt_4bit = _mm512_setr_epi64(
        0x0302020102010100llu, 0x0403030203020201llu,
        0x0302020102010100llu, 0x0403030203020201llu,
        0x0302020102010100llu, 0x0403030203020201llu,
        0x0302020102010100llu, 0x0403030203020201llu
    );

    const __m512i lo_nibble = _mm512_set1_epi8(0x0f);

    int local = 0;
    __m512i counter8bit_a = zero;
    __m512i counter8bit_b = zero;
    __m512i counter8bit_c = zero;
    __m512i counter8bit_d = zero;
    __m512i counter8bit_e = zero;
    __m512i counter8bit_f = zero;
    __m512i counter8bit_g = zero;
    __m512i counter8bit_h = zero;

    for (const uint8_t* end = &data[len & ~(4*64 - 1)]; data != end; data += 4*64) {
        // r0 = [a0|b0|c0|d0|e0|f0|g0|h0]
        // r1 = [a1|b1|c1|d1|e1|f1|g1|h1]
        // r2 = [a2|b2|c2|d2|e2|f2|g2|h2]
        // r3 = [a3|b3|c3|d3|e3|f3|g3|h3]
        const __m512i r0 = _mm512_loadu_si512((__m512i*)&data[0*64]);
        const __m512i r1 = _mm512_loadu_si512((__m512i*)&data[1*64]);
        const __m512i r2 = _mm512_loadu_si512((__m512i*)&data[2*64]);
        const __m512i r3 = _mm512_loadu_si512((__m512i*)&data[3*64]);

        // s0 = [a0|a1|c0|c1|e0|e1|g0|g1]
        // s1 = [b0|b1|d0|d1|f0|f1|h0|h1]
        // s2 = [a2|a3|c2|c3|e2|e3|g2|g3]
        // s3 = [b2|b3|d2|d3|f2|f3|h2|h3]
        const __m512i s0 = avx512_merge1_even(r0, r1);
        const __m512i s1 = avx512_merge1_odd (r0, r1);
        const __m512i s2 = avx512_merge1_even(r2, r3);
        const __m512i s3 = avx512_merge1_odd (r2, r3);

        // d0 = [a0|a1|a2|a3|e0|e1|e2|e3]
        // d1 = [b0|b1|b2|b3|f0|f1|f2|f3]
        // d2 = [c0|c1|c2|c3|g0|g1|g2|g3]
        // d3 = [d0|d1|d2|d3|h0|h1|h2|h3]
        const __m512i d0 = avx512_merge2_even(s0, s2);
        const __m512i d1 = avx512_merge2_even(s1, s3);
        const __m512i d2 = avx512_merge2_odd (s0, s2);
        const __m512i d3 = avx512_merge2_odd (s1, s3);

        // popcnt for 4-bit subwords in each registers
        const __m512i popcnt_a = _mm512_shuffle_epi8(popcnt_4bit, d0 & lo_nibble);
        const __m512i popcnt_e = _mm512_shuffle_epi8(popcnt_4bit, _mm512_srli_epi32(d0, 4) & lo_nibble);
        const __m512i popcnt_b = _mm512_shuffle_epi8(popcnt_4bit, d1 & lo_nibble);
        const __m512i popcnt_f = _mm512_shuffle_epi8(popcnt_4bit, _mm512_srli_epi32(d1, 4) & lo_nibble);
        const __m512i popcnt_c = _mm512_shuffle_epi8(popcnt_4bit, d2 & lo_nibble);
        const __m512i popcnt_g = _mm512_shuffle_epi8(popcnt_4bit, _mm512_srli_epi32(d2, 4) & lo_nibble);
        const __m512i popcnt_d = _mm512_shuffle_epi8(popcnt_4bit, d3 & lo_nibble);
        const __m512i popcnt_h = _mm512_shuffle_epi8(popcnt_4bit, _mm512_srli_epi32(d3, 4) & lo_nibble);

        counter8bit_a = _mm512_add_epi8(counter8bit_a, popcnt_a);
        counter8bit_b = _mm512_add_epi8(counter8bit_b, popcnt_b);
        counter8bit_c = _mm512_add_epi8(counter8bit_c, popcnt_c);
        counter8bit_d = _mm512_add_epi8(counter8bit_d, popcnt_d);
        counter8bit_e = _mm512_add_epi8(counter8bit_e, popcnt_e);
        counter8bit_f = _mm512_add_epi8(counter8bit_f, popcnt_f);
        counter8bit_g = _mm512_add_epi8(counter8bit_g, popcnt_g);
        counter8bit_h = _mm512_add_epi8(counter8bit_h, popcnt_h);

        local += 1;
        if (local == 63) {
            // avoid overflows in the 8-bit counters
#define U(n) \
            counter_##n = _mm512_add_epi64(counter_##n, _mm512_sad_epu8(counter8bit_##n, zero)); \
            counter8bit_##n = _mm512_setzero_si512();

            U(a) U(b) U(c) U(d)
            U(e) U(f) U(g) U(h)
#undef U
            local = 0;
        }
    }

    if (local != 0) {
#define U(n) counter_##n = _mm512_add_epi64(counter_##n, _mm512_sad_epu8(counter8bit_##n, zero));
        U(a) U(b) U(c) U(d)
        U(e) U(f) U(g) U(h)
#undef U
    }

    flag_counts[0] += avx512_sum_epu64(counter_a);
    flag_counts[1] += avx512_sum_epu64(counter_b);
    flag_counts[2] += avx512_sum_epu64(counter_c);
    flag_counts[3] += avx512_sum_epu64(counter_d);
    flag_counts[4] += avx512_sum_epu64(counter_e);
    flag_counts[5] += avx512_sum_epu64(counter_f);
    flag_counts[6] += avx512_sum_epu64(counter_g);
    flag_counts[7] += avx512_sum_epu64(counter_h);

    // scalar tail loop
    pospopcnt_u8_scalar_naive(data, len % (4*64), flag_counts);
}